

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

string * testing::internal::GetTypeName<CallInfo>(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_RDI;
  char *readable_name;
  int status;
  char *name;
  string *name_str;
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  int local_14;
  char *local_10;
  
  local_10 = std::type_info::name((type_info *)&CallInfo::typeinfo);
  local_14 = 0;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_demangle(local_10,0,0,&local_14);
  uVar1 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffde);
  free(this);
  return in_RDI;
}

Assistant:

std::string GetTypeName() {
# if GTEST_HAS_RTTI

  const char* const name = typeid(T).name();
#  if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#   if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#   endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, 0, 0, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return name_str;
#  else
  return name;
#  endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC

# else

  return "<type>";

# endif  // GTEST_HAS_RTTI
}